

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O1

void __thiscall gui::TextBox::setWidthCharacters(TextBox *this,size_t widthCharacters)

{
  float fVar1;
  float fVar2;
  float fVar3;
  element_type *peVar4;
  uint uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  FloatRect FVar6;
  string textBounds;
  locale local_90 [8];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  String local_68;
  string local_48;
  
  if (this->widthCharacters_ != widthCharacters) {
    this->widthCharacters_ = widthCharacters;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_48,(char)widthCharacters);
    peVar4 = (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::locale::locale(local_90);
    sf::String::String(&local_68,&local_48,local_90);
    sf::Text::setString(&peVar4->text_,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_68.m_string._M_dataplus._M_p != &local_68.m_string.field_2) {
      operator_delete(local_68.m_string._M_dataplus._M_p);
    }
    std::locale::~locale(local_90);
    FVar6 = sf::Text::getLocalBounds
                      (&((this->style_).
                         super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        text_);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = FVar6._0_8_;
    local_88._12_4_ = extraout_XMM0_Dd;
    local_78._8_4_ = in_XMM1_Dc;
    local_78._0_8_ = FVar6._8_8_;
    local_78._12_4_ = in_XMM1_Dd;
    peVar4 = (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    fVar1 = (peVar4->textPadding_).x;
    fVar2 = (peVar4->textPadding_).y;
    fVar3 = (peVar4->textPadding_).z;
    uVar5 = sf::Text::getCharacterSize(&peVar4->text_);
    (this->size_).x = fVar1 + fVar1 + (float)local_88._0_4_ + (float)local_78._0_4_;
    (this->size_).y = fVar2 + fVar2 + fVar3 * (float)uVar5;
    updateCaretPosition(this,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void TextBox::setWidthCharacters(size_t widthCharacters) {
    if (widthCharacters_ == widthCharacters) {
        return;
    }
    widthCharacters_ = widthCharacters;

    std::string textBounds(widthCharacters, 'A');
    style_->text_.setString(textBounds);

    const auto bounds = style_->text_.getLocalBounds();
    size_ = sf::Vector2f(
        2.0f * style_->textPadding_.x + bounds.left + bounds.width,
        2.0f * style_->textPadding_.y + style_->textPadding_.z * style_->getCharacterSize()
    );

    updateCaretPosition(0);
}